

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMem.c
# Opt level: O1

void Fraig_MemFixedRestart(Fraig_MemFixed_t *p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  
  if (1 < p->nChunks) {
    lVar6 = 1;
    do {
      if (p->pChunks[lVar6] != (char *)0x0) {
        free(p->pChunks[lVar6]);
        p->pChunks[lVar6] = (char *)0x0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < p->nChunks);
  }
  p->nChunks = 1;
  pcVar5 = *p->pChunks;
  iVar1 = p->nChunkSize;
  if (1 < iVar1) {
    iVar2 = p->nEntrySize;
    iVar4 = iVar1 + -1;
    pcVar3 = pcVar5;
    do {
      pcVar5 = pcVar3 + iVar2;
      *(char **)pcVar3 = pcVar5;
      iVar4 = iVar4 + -1;
      pcVar3 = pcVar5;
    } while (iVar4 != 0);
  }
  pcVar5[0] = '\0';
  pcVar5[1] = '\0';
  pcVar5[2] = '\0';
  pcVar5[3] = '\0';
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  p->pEntriesFree = *p->pChunks;
  p->nMemoryAlloc = p->nEntrySize * iVar1;
  p->nMemoryUsed = 0;
  p->nEntriesAlloc = iVar1;
  p->nEntriesUsed = 0;
  return;
}

Assistant:

void Fraig_MemFixedRestart( Fraig_MemFixed_t * p )
{
    int i;
    char * pTemp;

    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks = 1;
    // transform these entries into a linked list
    pTemp = p->pChunks[0];
    for ( i = 1; i < p->nChunkSize; i++ )
    {
        *((char **)pTemp) = pTemp + p->nEntrySize;
        pTemp += p->nEntrySize;
    }
    // set the last link
    *((char **)pTemp) = NULL;
    // set the free entry list
    p->pEntriesFree  = p->pChunks[0];
    // set the correct statistics
    p->nMemoryAlloc  = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed   = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed  = 0;
}